

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O1

void __thiscall
InsertProxyModelPrivate::checkExtraDataChanged
          (InsertProxyModelPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight,
          QVector<int> *roles)

{
  int iVar1;
  int iVar2;
  InsertProxyModel *pIVar3;
  QAbstractItemModel *pQVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  QModelIndex mappedParent;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  pIVar3 = this->q_ptr;
  pQVar4 = topLeft->m;
  if (pQVar4 == (QAbstractItemModel *)0x0) {
    local_60 = 0xffffffffffffffff;
    local_58 = 0;
    uStack_50 = 0;
  }
  else {
    (**(code **)(*(long *)pQVar4 + 0x68))(&local_60,pQVar4,topLeft);
  }
  (**(code **)(*(long *)pIVar3 + 400))(local_48,pIVar3,&local_60);
  plVar8 = (long *)QAbstractProxyModel::sourceModel();
  iVar6 = (**(code **)(*plVar8 + 0x80))(plVar8,local_48);
  plVar8 = (long *)QAbstractProxyModel::sourceModel();
  iVar7 = (**(code **)(*plVar8 + 0x78))(plVar8,local_48);
  iVar1 = bottomRight->r;
  if ((((iVar1 != topLeft->r) || (bottomRight->i != topLeft->i)) || (bottomRight->c != topLeft->c))
     || (((iVar1 < iVar7 || (bottomRight->m != topLeft->m)) || (bottomRight->c < iVar6)))) {
    iVar2 = bottomRight->c;
    if (iVar2 < iVar6) {
      if (iVar1 < iVar7) {
        return;
      }
      cVar5 = (**(code **)(*(long *)pIVar3 + 0x1c0))(pIVar3);
    }
    else {
      cVar5 = (**(code **)(*(long *)pIVar3 + 0x1c8))(pIVar3);
    }
    if (cVar5 != '\0') {
      commitToSource(this,iVar2 < iVar6);
    }
  }
  return;
}

Assistant:

void InsertProxyModelPrivate::checkExtraDataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles)
{
    Q_UNUSED(roles)
    Q_ASSERT(topLeft.isValid());
    Q_ASSERT(bottomRight.isValid());
    Q_Q(InsertProxyModel);
    Q_ASSERT(topLeft.model() == q);
    Q_ASSERT(bottomRight.model() == q);
    Q_ASSERT(topLeft.row() <= bottomRight.row());
    Q_ASSERT(topLeft.column() <= bottomRight.column());
    Q_ASSERT(topLeft.parent() == bottomRight.parent());
    const QModelIndex mappedParent = q->mapToSource(topLeft.parent());
    const int sourceCols = q->sourceModel()->columnCount(mappedParent);
    const int sourceRows = q->sourceModel()->rowCount(mappedParent);
    if (topLeft == bottomRight && bottomRight.column() >= sourceCols && bottomRight.row() >= sourceRows)
        return; // the corner changed
    if (bottomRight.column() >= sourceCols) {
        if (q->validColumn())
            commitColumn();
    } else if (bottomRight.row() >= sourceRows) {
        if (q->validRow())
            commitRow();
    }
}